

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_adds_a_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [16];
  byte bVar56;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  undefined1 auVar64 [16];
  undefined1 auVar74 [16];
  undefined4 uVar75;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  undefined1 auVar83 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined4 uVar57;
  undefined6 uVar58;
  undefined8 uVar59;
  unkuint9 Var60;
  undefined1 auVar61 [11];
  undefined1 auVar62 [12];
  undefined1 auVar63 [13];
  undefined6 uVar76;
  undefined8 uVar77;
  unkuint9 Var78;
  undefined1 auVar79 [11];
  undefined1 auVar80 [12];
  undefined1 auVar81 [13];
  undefined1 auVar82 [16];
  byte bVar84;
  byte bVar85;
  byte bVar86;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  bVar84 = *(byte *)pfVar1;
  bVar85 = *(byte *)((long)pfVar1 + 1);
  bVar86 = *(byte *)((long)pfVar1 + 2);
  bVar87 = *(byte *)((long)pfVar1 + 3);
  bVar88 = *(byte *)((long)pfVar1 + 4);
  bVar89 = *(byte *)((long)pfVar1 + 5);
  bVar90 = *(byte *)((long)pfVar1 + 6);
  bVar91 = *(byte *)((long)pfVar1 + 7);
  bVar92 = *(byte *)((long)pfVar1 + 8);
  bVar26 = *(byte *)((long)pfVar1 + 9);
  bVar27 = *(byte *)((long)pfVar1 + 10);
  bVar28 = *(byte *)((long)pfVar1 + 0xb);
  bVar29 = *(byte *)((long)pfVar1 + 0xc);
  bVar30 = *(byte *)((long)pfVar1 + 0xd);
  bVar31 = *(byte *)((long)pfVar1 + 0xe);
  bVar32 = *(byte *)((long)pfVar1 + 0xf);
  pfVar1 = (env->active_fpu).fpr + wt;
  bVar33 = *(byte *)pfVar1;
  bVar34 = *(byte *)((long)pfVar1 + 1);
  bVar35 = *(byte *)((long)pfVar1 + 2);
  bVar36 = *(byte *)((long)pfVar1 + 3);
  bVar37 = *(byte *)((long)pfVar1 + 4);
  bVar38 = *(byte *)((long)pfVar1 + 5);
  bVar39 = *(byte *)((long)pfVar1 + 6);
  bVar40 = *(byte *)((long)pfVar1 + 7);
  bVar41 = *(byte *)((long)pfVar1 + 8);
  bVar42 = *(byte *)((long)pfVar1 + 9);
  bVar43 = *(byte *)((long)pfVar1 + 10);
  bVar44 = *(byte *)((long)pfVar1 + 0xb);
  bVar45 = *(byte *)((long)pfVar1 + 0xc);
  bVar46 = *(byte *)((long)pfVar1 + 0xd);
  bVar47 = *(byte *)((long)pfVar1 + 0xe);
  bVar48 = *(byte *)((long)pfVar1 + 0xf);
  bVar56 = -bVar84;
  bVar65 = -bVar85;
  bVar66 = -bVar86;
  bVar67 = -bVar87;
  bVar68 = -bVar88;
  bVar69 = -bVar89;
  bVar70 = -bVar90;
  bVar71 = -bVar91;
  bVar72 = -bVar92;
  bVar73 = -bVar26;
  bVar2 = -bVar27;
  bVar3 = -bVar28;
  bVar4 = -bVar29;
  bVar5 = -bVar30;
  bVar6 = -bVar31;
  bVar7 = -bVar32;
  auVar83[0] = (bVar84 < bVar56) * bVar84 | (bVar84 >= bVar56) * bVar56;
  bVar84 = (bVar85 < bVar65) * bVar85 | (bVar85 >= bVar65) * bVar65;
  bVar85 = (bVar86 < bVar66) * bVar86 | (bVar86 >= bVar66) * bVar66;
  bVar86 = (bVar87 < bVar67) * bVar87 | (bVar87 >= bVar67) * bVar67;
  uVar75 = CONCAT13(bVar86,CONCAT12(bVar85,CONCAT11(bVar84,auVar83[0])));
  bVar87 = (bVar88 < bVar68) * bVar88 | (bVar88 >= bVar68) * bVar68;
  bVar88 = (bVar89 < bVar69) * bVar89 | (bVar89 >= bVar69) * bVar69;
  uVar76 = CONCAT15(bVar88,CONCAT14(bVar87,uVar75));
  bVar89 = (bVar90 < bVar70) * bVar90 | (bVar90 >= bVar70) * bVar70;
  bVar90 = (bVar91 < bVar71) * bVar91 | (bVar91 >= bVar71) * bVar71;
  uVar77 = CONCAT17(bVar90,CONCAT16(bVar89,uVar76));
  bVar91 = (bVar92 < bVar72) * bVar92 | (bVar92 >= bVar72) * bVar72;
  Var78 = CONCAT18(bVar91,uVar77);
  bVar92 = (bVar26 < bVar73) * bVar26 | (bVar26 >= bVar73) * bVar73;
  auVar79._0_10_ = CONCAT19(bVar92,Var78);
  auVar79[10] = (bVar27 < bVar2) * bVar27 | (bVar27 >= bVar2) * bVar2;
  auVar80[0xb] = (bVar28 < bVar3) * bVar28 | (bVar28 >= bVar3) * bVar3;
  auVar80._0_11_ = auVar79;
  auVar81[0xc] = (bVar29 < bVar4) * bVar29 | (bVar29 >= bVar4) * bVar4;
  auVar81._0_12_ = auVar80;
  auVar82[0xd] = (bVar30 < bVar5) * bVar30 | (bVar30 >= bVar5) * bVar5;
  auVar82._0_13_ = auVar81;
  auVar82[0xe] = (bVar31 < bVar6) * bVar31 | (bVar31 >= bVar6) * bVar6;
  auVar82[0xf] = (bVar32 < bVar7) * bVar32 | (bVar32 >= bVar7) * bVar7;
  bVar56 = -bVar33;
  bVar65 = -bVar34;
  bVar66 = -bVar35;
  bVar67 = -bVar36;
  bVar68 = -bVar37;
  bVar69 = -bVar38;
  bVar70 = -bVar39;
  bVar71 = -bVar40;
  bVar72 = -bVar41;
  bVar73 = -bVar42;
  bVar2 = -bVar43;
  bVar3 = -bVar44;
  bVar4 = -bVar45;
  bVar5 = -bVar46;
  bVar6 = -bVar47;
  bVar7 = -bVar48;
  bVar56 = (bVar33 < bVar56) * bVar33 | (bVar33 >= bVar56) * bVar56;
  bVar65 = (bVar34 < bVar65) * bVar34 | (bVar34 >= bVar65) * bVar65;
  bVar66 = (bVar35 < bVar66) * bVar35 | (bVar35 >= bVar66) * bVar66;
  bVar67 = (bVar36 < bVar67) * bVar36 | (bVar36 >= bVar67) * bVar67;
  uVar57 = CONCAT13(bVar67,CONCAT12(bVar66,CONCAT11(bVar65,bVar56)));
  bVar68 = (bVar37 < bVar68) * bVar37 | (bVar37 >= bVar68) * bVar68;
  bVar69 = (bVar38 < bVar69) * bVar38 | (bVar38 >= bVar69) * bVar69;
  uVar58 = CONCAT15(bVar69,CONCAT14(bVar68,uVar57));
  bVar70 = (bVar39 < bVar70) * bVar39 | (bVar39 >= bVar70) * bVar70;
  bVar71 = (bVar40 < bVar71) * bVar40 | (bVar40 >= bVar71) * bVar71;
  uVar59 = CONCAT17(bVar71,CONCAT16(bVar70,uVar58));
  bVar72 = (bVar41 < bVar72) * bVar41 | (bVar41 >= bVar72) * bVar72;
  Var60 = CONCAT18(bVar72,uVar59);
  bVar73 = (bVar42 < bVar73) * bVar42 | (bVar42 >= bVar73) * bVar73;
  auVar61._0_10_ = CONCAT19(bVar73,Var60);
  auVar61[10] = (bVar43 < bVar2) * bVar43 | (bVar43 >= bVar2) * bVar2;
  auVar62[0xb] = (bVar44 < bVar3) * bVar44 | (bVar44 >= bVar3) * bVar3;
  auVar62._0_11_ = auVar61;
  auVar63[0xc] = (bVar45 < bVar4) * bVar45 | (bVar45 >= bVar4) * bVar4;
  auVar63._0_12_ = auVar62;
  auVar97[0xd] = (bVar46 < bVar5) * bVar46 | (bVar46 >= bVar5) * bVar5;
  auVar97._0_13_ = auVar63;
  auVar97[0xe] = (bVar47 < bVar6) * bVar47 | (bVar47 >= bVar6) * bVar6;
  auVar97[0xf] = (bVar48 < bVar7) * bVar48 | (bVar48 >= bVar7) * bVar7;
  auVar93 = auVar82 | auVar97;
  auVar64[0] = bVar56 + auVar83[0];
  auVar64[1] = bVar65 + bVar84;
  auVar64[2] = bVar66 + bVar85;
  auVar64[3] = bVar67 + bVar86;
  auVar64[4] = bVar68 + bVar87;
  auVar64[5] = bVar69 + bVar88;
  auVar64[6] = bVar70 + bVar89;
  auVar64[7] = bVar71 + bVar90;
  auVar64[8] = bVar72 + bVar91;
  auVar64[9] = bVar73 + bVar92;
  auVar64[10] = auVar61[10] + auVar79[10];
  auVar64[0xb] = auVar62[0xb] + auVar80[0xb];
  auVar64[0xc] = auVar63[0xc] + auVar81[0xc];
  auVar64[0xd] = auVar97[0xd] + auVar82[0xd];
  auVar64[0xe] = auVar97[0xe] + auVar82[0xe];
  auVar64[0xf] = auVar97[0xf] + auVar82[0xf];
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar81;
  auVar8[0xe] = bVar90;
  auVar10[0xc] = bVar89;
  auVar10._0_12_ = auVar80;
  auVar10._13_2_ = auVar8._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar79;
  auVar12._12_3_ = auVar10._12_3_;
  auVar14[10] = bVar88;
  auVar14._0_10_ = auVar79._0_10_;
  auVar14._11_4_ = auVar12._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = Var78;
  auVar16._10_5_ = auVar14._10_5_;
  auVar18[8] = bVar87;
  auVar18._0_8_ = uVar77;
  auVar18._9_6_ = auVar16._9_6_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar18._8_7_;
  auVar20[6] = bVar86;
  auVar20._0_6_ = uVar76;
  auVar20._7_8_ = SUB158(auVar49 << 0x40,7);
  auVar50._9_6_ = 0;
  auVar50._0_9_ = auVar20._6_9_;
  auVar22[4] = bVar85;
  auVar22._0_4_ = uVar75;
  auVar22._5_10_ = SUB1510(auVar50 << 0x30,5);
  auVar51._11_4_ = 0;
  auVar51._0_11_ = auVar22._4_11_;
  auVar24[2] = bVar84;
  auVar24._0_2_ = CONCAT11(bVar84,auVar83[0]);
  auVar24._3_12_ = SUB1512(auVar51 << 0x20,3);
  auVar83[1] = 0;
  auVar83._2_13_ = auVar24._2_13_;
  auVar83[0xf] = 0;
  auVar74[1] = 0;
  auVar74[0] = bVar91;
  auVar74[2] = bVar92;
  auVar74[3] = 0;
  auVar74[4] = auVar79[10];
  auVar74[5] = 0;
  auVar74[6] = auVar80[0xb];
  auVar74[7] = 0;
  auVar74[8] = auVar81[0xc];
  auVar74[9] = 0;
  auVar74[10] = auVar82[0xd];
  auVar74[0xb] = 0;
  auVar74[0xc] = auVar82[0xe];
  auVar74[0xd] = 0;
  auVar74[0xe] = auVar82[0xf];
  auVar74[0xf] = 0;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar63;
  auVar9[0xe] = bVar71;
  auVar11[0xc] = bVar70;
  auVar11._0_12_ = auVar62;
  auVar11._13_2_ = auVar9._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar61;
  auVar13._12_3_ = auVar11._12_3_;
  auVar15[10] = bVar69;
  auVar15._0_10_ = auVar61._0_10_;
  auVar15._11_4_ = auVar13._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = Var60;
  auVar17._10_5_ = auVar15._10_5_;
  auVar19[8] = bVar68;
  auVar19._0_8_ = uVar59;
  auVar19._9_6_ = auVar17._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar19._8_7_;
  auVar21[6] = bVar67;
  auVar21._0_6_ = uVar58;
  auVar21._7_8_ = SUB158(auVar52 << 0x40,7);
  auVar53._9_6_ = 0;
  auVar53._0_9_ = auVar21._6_9_;
  auVar23[4] = bVar66;
  auVar23._0_4_ = uVar57;
  auVar23._5_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54._11_4_ = 0;
  auVar54._0_11_ = auVar23._4_11_;
  auVar25[2] = bVar65;
  auVar25._0_2_ = CONCAT11(bVar65,bVar56);
  auVar25._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar55[0] = -(auVar93[0] < '\0');
  auVar55[1] = -(auVar93[1] < '\0');
  auVar55[2] = -(auVar93[2] < '\0');
  auVar55[3] = -(auVar93[3] < '\0');
  auVar55[4] = -(auVar93[4] < '\0');
  auVar55[5] = -(auVar93[5] < '\0');
  auVar55[6] = -(auVar93[6] < '\0');
  auVar55[7] = -(auVar93[7] < '\0');
  auVar55[8] = -(auVar93[8] < '\0');
  auVar55[9] = -(auVar93[9] < '\0');
  auVar55[10] = -(auVar93[10] < '\0');
  auVar55[0xb] = -(auVar93[0xb] < '\0');
  auVar55[0xc] = -(auVar93[0xc] < '\0');
  auVar55[0xd] = -(auVar93[0xd] < '\0');
  auVar55[0xe] = -(auVar93[0xe] < '\0');
  auVar55[0xf] = -(auVar93[0xf] < '\0');
  auVar95._0_2_ = 0x7f - (ushort)bVar56;
  auVar95._2_2_ = 0x7f - auVar25._2_2_;
  auVar95._4_2_ = 0x7f - auVar23._4_2_;
  auVar95._6_2_ = 0x7f - auVar21._6_2_;
  auVar95._8_2_ = 0x7f - auVar19._8_2_;
  auVar95._10_2_ = 0x7f - auVar15._10_2_;
  auVar95._12_2_ = 0x7f - auVar11._12_2_;
  auVar95._14_2_ = 0x7f - (auVar9._13_2_ >> 8);
  auVar93._0_2_ = 0x7f - (ushort)bVar72;
  auVar93._2_2_ = 0x7f - (ushort)bVar73;
  auVar93._4_2_ = 0x7f - (ushort)auVar61[10];
  auVar93._6_2_ = 0x7f - (ushort)auVar62[0xb];
  auVar93._8_2_ = 0x7f - (ushort)auVar63[0xc];
  auVar93._10_2_ = 0x7f - (ushort)auVar97[0xd];
  auVar93._12_2_ = 0x7f - (ushort)auVar97[0xe];
  auVar93._14_2_ = 0x7f - (ushort)auVar97[0xf];
  auVar74 = auVar74 | _DAT_00d83570;
  auVar93 = auVar93 ^ _DAT_00d83570;
  auVar94._0_2_ = -(ushort)(auVar74._0_2_ < auVar93._0_2_);
  auVar94._2_2_ = -(ushort)(auVar74._2_2_ < auVar93._2_2_);
  auVar94._4_2_ = -(ushort)(auVar74._4_2_ < auVar93._4_2_);
  auVar94._6_2_ = -(ushort)(auVar74._6_2_ < auVar93._6_2_);
  auVar94._8_2_ = -(ushort)(auVar74._8_2_ < auVar93._8_2_);
  auVar94._10_2_ = -(ushort)(auVar74._10_2_ < auVar93._10_2_);
  auVar94._12_2_ = -(ushort)(auVar74._12_2_ < auVar93._12_2_);
  auVar94._14_2_ = -(ushort)(auVar74._14_2_ < auVar93._14_2_);
  auVar83 = auVar83 | _DAT_00d83570;
  auVar95 = auVar95 ^ _DAT_00d83570;
  auVar96._0_2_ = -(ushort)(auVar83._0_2_ < auVar95._0_2_);
  auVar96._2_2_ = -(ushort)(auVar83._2_2_ < auVar95._2_2_);
  auVar96._4_2_ = -(ushort)(auVar83._4_2_ < auVar95._4_2_);
  auVar96._6_2_ = -(ushort)(auVar83._6_2_ < auVar95._6_2_);
  auVar96._8_2_ = -(ushort)(auVar83._8_2_ < auVar95._8_2_);
  auVar96._10_2_ = -(ushort)(auVar83._10_2_ < auVar95._10_2_);
  auVar96._12_2_ = -(ushort)(auVar83._12_2_ < auVar95._12_2_);
  auVar96._14_2_ = -(ushort)(auVar83._14_2_ < auVar95._14_2_);
  auVar97 = packsswb(auVar96,auVar94);
  (env->active_fpu).fpr[wd] =
       (fpr_t)(auVar55 & _DAT_00d83330 | ~auVar55 & (~auVar97 & _DAT_00d83330 | auVar64 & auVar97));
  return;
}

Assistant:

void helper_msa_adds_a_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_adds_a_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_adds_a_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_adds_a_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_adds_a_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_adds_a_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_adds_a_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_adds_a_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_adds_a_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_adds_a_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_adds_a_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_adds_a_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_adds_a_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_adds_a_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_adds_a_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_adds_a_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_adds_a_df(DF_BYTE, pws->b[15], pwt->b[15]);
}